

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptrcircularlist.h
# Opt level: O0

bool __thiscall cookmem::CircularList<Node>::contains(CircularList<Node> *this,Node *chunk)

{
  Node *local_28;
  Node *node;
  Node *chunk_local;
  CircularList<Node> *this_local;
  
  if (this->m_head != (Node *)0x0) {
    local_28 = this->m_head;
    do {
      if (local_28 == chunk) {
        return true;
      }
      local_28 = local_28->next;
    } while (local_28 != this->m_head);
  }
  return false;
}

Assistant:

bool
    contains (Node* chunk)
    {
        if (m_head == nullptr)
        {
            return false;
        }
        Node* node = m_head;
        do
        {
            if (node == chunk)
            {
                return true;
            }
            node = node->next;
        }
        while (node != m_head);
        return false;
    }